

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

istream * __thiscall amrex::DistributionMapping::readFrom(DistributionMapping *this,istream *is)

{
  bool bVar1;
  void *this_00;
  iterator msg;
  reference piVar2;
  ulong uVar3;
  istream *in_RSI;
  Ref *in_RDI;
  int *x;
  iterator __end1;
  iterator __begin1;
  Vector<int,_std::allocator<int>_> *__range1;
  int n;
  Vector<int,_std::allocator<int>_> *pmap;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  int local_24;
  element_type *local_20;
  istream *local_18;
  char *local_8;
  
  local_18 = in_RSI;
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x11fb17d);
  Ref::clear(in_RDI);
  local_20 = std::
             __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11fb18f);
  this_00 = (void *)std::istream::ignore((long)local_18,100000);
  std::istream::operator>>(this_00,&local_24);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  msg = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffffa8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffc8);
    std::istream::operator>>(local_18,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffc8);
  }
  std::istream::ignore((long)local_18,100000);
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) != 0) {
    local_8 = "DistributionMapping::readFrom(istream&) failed";
    Error_host((char *)msg._M_current);
  }
  return local_18;
}

Assistant:

std::istream&
DistributionMapping::readFrom (std::istream& is)
{
    AMREX_ASSERT(size() == 0);
    m_ref->clear();
    auto& pmap = m_ref->m_pmap;

    int n;
    is.ignore(100000, '(') >> n;
    pmap.resize(n);
    for (auto& x : pmap) {
        is >> x;
    }
    is.ignore(100000, ')');
    if (is.fail()) {
        amrex::Error("DistributionMapping::readFrom(istream&) failed");
    }
    return is;
}